

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O2

void Ssw_RarTranspose(Ssw_RarMan_t *p)

{
  Aig_Obj_t *pAVar1;
  word *pwVar2;
  word wVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int local_240;
  word M [64];
  
  local_240 = 0x3f;
  for (lVar6 = 0; lVar6 < p->pPars->nWords; lVar6 = lVar6 + 1) {
    iVar5 = 0x3f;
    for (lVar8 = 0; lVar8 < p->nWordsReg; lVar8 = lVar8 + 1) {
      iVar4 = iVar5;
      for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 1) {
        if (iVar4 < p->pAig->nRegs) {
          pAVar1 = Saig_ManLi(p->pAig,iVar4);
          pwVar2 = Ssw_RarObjSim(p,pAVar1->Id);
          wVar3 = pwVar2[lVar6];
        }
        else {
          wVar3 = 0;
        }
        M[lVar7] = wVar3;
        iVar4 = iVar4 + -1;
      }
      transpose64(M);
      iVar4 = local_240;
      for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 1) {
        wVar3 = M[lVar7];
        pwVar2 = Ssw_RarPatSim(p,iVar4);
        pwVar2[lVar8] = wVar3;
        iVar4 = iVar4 + -1;
      }
      iVar5 = iVar5 + 0x40;
    }
    local_240 = local_240 + 0x40;
  }
  return;
}

Assistant:

void Ssw_RarTranspose( Ssw_RarMan_t * p )
{
    Aig_Obj_t * pObj;
    word M[64];
    int w, r, i;
    for ( w = 0; w < p->pPars->nWords; w++ )
    for ( r = 0; r < p->nWordsReg; r++ )
    {
        // save input
        for ( i = 0; i < 64; i++ )
        {
            if ( r*64 + 63-i < Aig_ManRegNum(p->pAig) )
            {
                pObj = Saig_ManLi( p->pAig, r*64 + 63-i );
                M[i] = Ssw_RarObjSim( p, Aig_ObjId(pObj) )[w];
            }
            else
                M[i] = 0;
        }
        // transpose
        transpose64( M );
        // save output
        for ( i = 0; i < 64; i++ )
            Ssw_RarPatSim( p, w*64 + 63-i )[r] = M[i];
    }
/*
    Saig_ManForEachLi( p->pAig, pObj, i )
    {
        word * pBitData = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
        Extra_PrintBinary( stdout, (unsigned *)pBitData, 64*p->pPars->nWords ); Abc_Print( 1, "\n" );
    }
    Abc_Print( 1, "\n" );
    for ( i = 0; i < p->pPars->nWords*64; i++ )
    {
        word * pBitData = Ssw_RarPatSim( p, i );
        Extra_PrintBinary( stdout, (unsigned *)pBitData, Aig_ManRegNum(p->pAig) ); Abc_Print( 1, "\n" );
    }
    Abc_Print( 1, "\n" );
*/
}